

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageSupport::initPrograms
          (ImageSupport *this,SourceCollections *programCollection)

{
  int iVar1;
  ostream *poVar2;
  VkImageType in_ECX;
  VkFormat in_EDX;
  string local_398;
  string local_378;
  ostringstream local_358 [8];
  ostringstream mainSrc;
  ostringstream local_1e0 [8];
  ostringstream declSrc;
  undefined1 local_58 [8];
  string imageType;
  string imageFormat;
  SourceCollections *programCollection_local;
  ImageSupport *this_local;
  
  synchronization::(anonymous_namespace)::getShaderImageFormatQualifier_abi_cxx11_
            ((string *)((long)&imageType.field_2 + 8),
             (_anonymous_namespace_ *)(ulong)(this->m_resourceDesc).imageFormat,in_EDX);
  synchronization::(anonymous_namespace)::getShaderImageType_abi_cxx11_
            ((string *)local_58,(_anonymous_namespace_ *)(ulong)(this->m_resourceDesc).imageFormat,
             (this->m_resourceDesc).imageType,in_ECX);
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  poVar2 = std::operator<<((ostream *)local_1e0,"layout(set = 0, binding = 0, ");
  poVar2 = std::operator<<(poVar2,(string *)(imageType.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,") readonly  uniform ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  poVar2 = std::operator<<(poVar2," srcImg;\n");
  poVar2 = std::operator<<(poVar2,"layout(set = 0, binding = 1, ");
  poVar2 = std::operator<<(poVar2,(string *)(imageType.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,") writeonly uniform ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  std::operator<<(poVar2," dstImg;\n");
  std::__cxx11::ostringstream::ostringstream(local_358);
  if ((this->m_resourceDesc).imageType == VK_IMAGE_TYPE_1D) {
    poVar2 = std::operator<<((ostream *)local_358,"    for (int x = 0; x < ");
    iVar1 = tcu::Vector<int,_4>::x(&(this->m_resourceDesc).size);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"; ++x)\n");
    std::operator<<(poVar2,"        imageStore(dstImg, x, imageLoad(srcImg, x));\n");
  }
  else if ((this->m_resourceDesc).imageType == VK_IMAGE_TYPE_2D) {
    poVar2 = std::operator<<((ostream *)local_358,"    for (int y = 0; y < ");
    iVar1 = tcu::Vector<int,_4>::y(&(this->m_resourceDesc).size);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"; ++y)\n");
    poVar2 = std::operator<<(poVar2,"    for (int x = 0; x < ");
    iVar1 = tcu::Vector<int,_4>::x(&(this->m_resourceDesc).size);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"; ++x)\n");
    std::operator<<(poVar2,
                    "        imageStore(dstImg, ivec2(x, y), imageLoad(srcImg, ivec2(x, y)));\n");
  }
  else if ((this->m_resourceDesc).imageType == VK_IMAGE_TYPE_3D) {
    poVar2 = std::operator<<((ostream *)local_358,"    for (int z = 0; z < ");
    iVar1 = tcu::Vector<int,_4>::z(&(this->m_resourceDesc).size);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"; ++z)\n");
    poVar2 = std::operator<<(poVar2,"    for (int y = 0; y < ");
    iVar1 = tcu::Vector<int,_4>::y(&(this->m_resourceDesc).size);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"; ++y)\n");
    poVar2 = std::operator<<(poVar2,"    for (int x = 0; x < ");
    iVar1 = tcu::Vector<int,_4>::x(&(this->m_resourceDesc).size);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,"; ++x)\n");
    std::operator<<(poVar2,
                    "        imageStore(dstImg, ivec3(x, y, z), imageLoad(srcImg, ivec3(x, y, z)));\n"
                   );
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  initPassthroughPrograms
            (programCollection,&this->m_shaderPrefix,&local_378,&local_398,this->m_stage);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::ostringstream::~ostringstream(local_358);
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(imageType.field_2._M_local_buf + 8));
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		const std::string	imageFormat	= getShaderImageFormatQualifier(m_resourceDesc.imageFormat);
		const std::string	imageType	= getShaderImageType(m_resourceDesc.imageFormat, m_resourceDesc.imageType);

		std::ostringstream declSrc;
		declSrc << "layout(set = 0, binding = 0, " << imageFormat << ") readonly  uniform " << imageType << " srcImg;\n"
				<< "layout(set = 0, binding = 1, " << imageFormat << ") writeonly uniform " << imageType << " dstImg;\n";

		std::ostringstream mainSrc;
		if (m_resourceDesc.imageType == VK_IMAGE_TYPE_1D)
			mainSrc << "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, x, imageLoad(srcImg, x));\n";
		else if (m_resourceDesc.imageType == VK_IMAGE_TYPE_2D)
			mainSrc << "    for (int y = 0; y < " << m_resourceDesc.size.y() << "; ++y)\n"
					<< "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, ivec2(x, y), imageLoad(srcImg, ivec2(x, y)));\n";
		else if (m_resourceDesc.imageType == VK_IMAGE_TYPE_3D)
			mainSrc << "    for (int z = 0; z < " << m_resourceDesc.size.z() << "; ++z)\n"
					<< "    for (int y = 0; y < " << m_resourceDesc.size.y() << "; ++y)\n"
					<< "    for (int x = 0; x < " << m_resourceDesc.size.x() << "; ++x)\n"
					<< "        imageStore(dstImg, ivec3(x, y, z), imageLoad(srcImg, ivec3(x, y, z)));\n";
		else
			DE_ASSERT(0);

		initPassthroughPrograms(programCollection, m_shaderPrefix, declSrc.str(), mainSrc.str(), m_stage);
	}